

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotText(char *text,double x,double y,bool vertical,ImVec2 *pixel_offset)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImU32 col;
  ImDrawList *this;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec4 IVar5;
  ImVec2 pos;
  float local_68;
  float fStack_64;
  undefined8 local_58;
  double dStack_50;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    this = GetPlotDrawList();
    PushPlotClipRect(0.0);
    fVar1 = (GImPlot->Style).Colors[0xc].w;
    if ((fVar1 != -1.0) || (NAN(fVar1))) {
      fVar1 = (GImPlot->Style).Colors[0xc].x;
      fVar2 = (GImPlot->Style).Colors[0xc].y;
      dStack_50 = *(double *)&(GImPlot->Style).Colors[0xc].z;
    }
    else {
      IVar5 = GetAutoColor(0xc);
      dStack_50 = IVar5._8_8_;
      fVar1 = IVar5.x;
      fVar2 = IVar5.y;
    }
    local_58 = (double)CONCAT44(fVar2,fVar1);
    col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&local_58);
    if (vertical) {
      IVar3 = ImGui::CalcTextSize(text,(char *)0x0,false,-1.0);
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_4_ = IVar3.x;
      local_48._4_4_ = IVar3.y;
      local_48._12_4_ = extraout_XMM0_Dd;
      local_58 = x;
      dStack_50 = y;
      IVar4 = PlotToPixels((ImPlotPoint *)&local_58,-1);
      IVar3.y = IVar4.y + (float)local_48._0_4_ * 0.5 + (*pixel_offset).y;
      IVar3.x = (IVar4.x - (float)local_48._4_4_ * 0.5) + (*pixel_offset).x;
      AddTextVertical(this,IVar3,col,text,(char *)0x0);
    }
    else {
      local_58 = x;
      dStack_50 = y;
      IVar3 = PlotToPixels((ImPlotPoint *)&local_58,-1);
      IVar4 = ImGui::CalcTextSize(text,(char *)0x0,false,-1.0);
      local_68 = IVar3.x;
      fStack_64 = IVar3.y;
      local_38.x = (*pixel_offset).x + IVar4.x * -0.5 + local_68;
      local_38.y = (*pixel_offset).y + IVar4.y * -0.5 + fStack_64;
      ImDrawList::AddText(this,&local_38,col,text,(char *)0x0);
    }
    PopPlotClipRect();
    return;
  }
  __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotText() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot_items.cpp"
                ,0x8b9,"void ImPlot::PlotText(const char *, double, double, bool, const ImVec2 &)");
}

Assistant:

void PlotText(const char* text, double x, double y, bool vertical, const ImVec2& pixel_offset) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotText() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    PushPlotClipRect();
    ImU32 colTxt = GetStyleColorU32(ImPlotCol_InlayText);
    if (vertical) {
        ImVec2 ctr = CalcTextSizeVertical(text) * 0.5f;
        ImVec2 pos = PlotToPixels(ImPlotPoint(x,y)) + ImVec2(-ctr.x, ctr.y) + pixel_offset;
        AddTextVertical(&DrawList, pos, colTxt, text);
    }
    else {
        ImVec2 pos = PlotToPixels(ImPlotPoint(x,y)) - ImGui::CalcTextSize(text) * 0.5f + pixel_offset;
        DrawList.AddText(pos, colTxt, text);
    }
    PopPlotClipRect();
}